

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_ports::test_method(addrman_ports *this)

{
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  bool bVar1;
  long in_FS_OFFSET;
  bool new_only;
  __single_object addrman;
  CAddress addr_ret3;
  CAddress addr_ret2;
  CService addr1_port;
  CService addr1;
  CNetAddr source;
  char *in_stack_fffffffffffff5c8;
  char *in_stack_fffffffffffff5d0;
  char *in_stack_fffffffffffff5d8;
  _Optional_payload_base<bool> _Var2;
  AddrMan *in_stack_fffffffffffff5e0;
  _Optional_payload_base<Network> in_stack_fffffffffffff5e8;
  CService *in_stack_fffffffffffff5f0;
  CAddress *in_stack_fffffffffffff5f8;
  CService *in_stack_fffffffffffff600;
  NodeContext *in_stack_fffffffffffff608;
  iterator in_stack_fffffffffffff610;
  string *in_stack_fffffffffffff618;
  string *in_stack_fffffffffffff620;
  uint16_t in_stack_fffffffffffff6b6;
  undefined1 *local_8f0;
  undefined1 *local_870;
  undefined1 local_778 [16];
  undefined1 local_768 [64];
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined1 local_6f0 [8];
  undefined8 local_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [64];
  const_string local_690 [2];
  lazy_ostream local_670 [2];
  assertion_result local_650 [2];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined1 local_5d8 [8];
  undefined8 local_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [64];
  const_string local_578 [2];
  lazy_ostream local_558 [4];
  assertion_result local_518 [2];
  allocator<char> local_4d9;
  undefined1 local_4d8 [8];
  undefined8 local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [64];
  const_string local_478 [2];
  lazy_ostream local_458 [4];
  assertion_result local_418 [2];
  allocator<char> local_3d9;
  undefined1 local_3d8 [8];
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [67];
  allocator<char> local_375;
  int32_t local_374;
  optional<Network> local_368;
  optional<Network> local_360;
  optional<Network> local_358;
  optional<Network> local_350;
  undefined1 local_348 [472];
  undefined1 local_170 [56];
  undefined1 local_138 [112];
  undefined1 local_c8 [56];
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_374 = GetCheckRatio(in_stack_fffffffffffff608);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_fffffffffffff600,(bool *)in_stack_fffffffffffff5f8,
             (int *)in_stack_fffffffffffff5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
             (allocator<char> *)in_stack_fffffffffffff608);
  ResolveIP(in_stack_fffffffffffff620);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8);
  std::allocator<char>::~allocator(&local_375);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,(char (*) [1])in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff5d8 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    std::optional<Network>::optional(&local_350);
    std::optional<bool>::optional((optional<bool> *)(local_3d8 + 6));
    local_3d0 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff5d0,
                              (optional<Network>)in_stack_fffffffffffff5e8,(optional<bool>)_Var2);
    local_3d8._0_4_ = 0;
    in_stack_fffffffffffff5d8 = "0U";
    in_stack_fffffffffffff5d0 = local_3d8;
    in_stack_fffffffffffff5c8 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3b8,local_3c8,0x73,1,2,&local_3d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
             (allocator<char> *)in_stack_fffffffffffff608);
  ResolveService(in_stack_fffffffffffff618,in_stack_fffffffffffff6b6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8);
  std::allocator<char>::~allocator(&local_3d9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    CService::CService((CService *)in_stack_fffffffffffff5d8,(CService *)in_stack_fffffffffffff5d0);
    CAddress::CAddress(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                       (ServiceFlags)in_stack_fffffffffffff5e8);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff5c8);
    __l._M_len = (size_type)in_stack_fffffffffffff618;
    __l._M_array = in_stack_fffffffffffff610;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff608,__l,
               (allocator_type *)in_stack_fffffffffffff600);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff5d8,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff5d0,
                 (CNetAddr *)in_stack_fffffffffffff5c8,(seconds)in_stack_fffffffffffff5e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff5d8,
               SUB81((ulong)in_stack_fffffffffffff5d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff5c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_418,local_458,local_478,0x77,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5c8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff5d8);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff5c8);
    local_870 = local_90;
    do {
      local_870 = local_870 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff5c8);
    } while (local_870 != local_c8);
    CService::~CService((CService *)in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,(char (*) [1])in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff5d8 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    std::optional<Network>::optional(&local_358);
    std::optional<bool>::optional((optional<bool> *)(local_4d8 + 6));
    local_4d0 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff5d0,
                              (optional<Network>)in_stack_fffffffffffff5e8,(optional<bool>)_Var2);
    local_4d8._0_4_ = 1;
    in_stack_fffffffffffff5d8 = "1U";
    in_stack_fffffffffffff5d0 = local_4d8;
    in_stack_fffffffffffff5c8 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_4b8,local_4c8,0x78,1,2,&local_4d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
             (allocator<char> *)in_stack_fffffffffffff608);
  ResolveService(in_stack_fffffffffffff618,in_stack_fffffffffffff6b6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8);
  std::allocator<char>::~allocator(&local_4d9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    CService::CService((CService *)in_stack_fffffffffffff5d8,(CService *)in_stack_fffffffffffff5d0);
    CAddress::CAddress(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                       (ServiceFlags)in_stack_fffffffffffff5e8);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_fffffffffffff5c8);
    __l_00._M_len = (size_type)in_stack_fffffffffffff618;
    __l_00._M_array = in_stack_fffffffffffff610;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff608,__l_00,
               (allocator_type *)in_stack_fffffffffffff600);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_fffffffffffff5d8,
                 (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff5d0,
                 (CNetAddr *)in_stack_fffffffffffff5c8,(seconds)in_stack_fffffffffffff5e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff5d8,
               SUB81((ulong)in_stack_fffffffffffff5d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff5c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_518,local_558,local_578,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5c8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff5d8);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_fffffffffffff5c8);
    local_8f0 = local_138;
    do {
      local_8f0 = local_8f0 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_fffffffffffff5c8);
    } while (local_8f0 != local_170);
    CService::~CService((CService *)in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,(char (*) [1])in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff5d8 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    std::optional<Network>::optional(&local_360);
    std::optional<bool>::optional((optional<bool> *)(local_5d8 + 6));
    local_5d0 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff5d0,
                              (optional<Network>)in_stack_fffffffffffff5e8,(optional<bool>)_Var2);
    local_5d8._0_4_ = 2;
    in_stack_fffffffffffff5d8 = "2U";
    in_stack_fffffffffffff5d0 = local_5d8;
    in_stack_fffffffffffff5c8 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_5b8,local_5c8,0x7c,1,2,&local_5d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
  local_5f8 = 0;
  uStack_5f0 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_5e8 = 0;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff5c8);
  AddrMan::Select(in_stack_fffffffffffff5e0,SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff5d0);
  CAddress::CAddress((CAddress *)in_stack_fffffffffffff5d8,(CAddress *)in_stack_fffffffffffff5d0);
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *)in_stack_fffffffffffff5c8);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_fffffffffffff5c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff600);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
    if (!bVar1) {
      CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff600);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff5d8,
               SUB81((ulong)in_stack_fffffffffffff5d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff5c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_650,local_670,local_690,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5c8);
    if (!bVar1) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5c8);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
  CService::CService((CService *)in_stack_fffffffffffff5d8,(CService *)in_stack_fffffffffffff5d0);
  CAddress::CAddress(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                     (ServiceFlags)in_stack_fffffffffffff5e8);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Good((AddrMan *)in_stack_fffffffffffff5d8,(CService *)in_stack_fffffffffffff5d0,
                (NodeSeconds)in_stack_fffffffffffff5e8);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff5c8);
  CService::~CService((CService *)in_stack_fffffffffffff5c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,(char (*) [1])in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    _Var2 = SUB82((ulong)in_stack_fffffffffffff5d8 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
    std::optional<Network>::optional(&local_368);
    std::optional<bool>::optional((optional<bool> *)(local_6f0 + 6));
    local_6e8 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff5d0,
                              (optional<Network>)in_stack_fffffffffffff5e8,(optional<bool>)_Var2);
    local_6f0._0_4_ = 2;
    in_stack_fffffffffffff5d8 = "2U";
    in_stack_fffffffffffff5d0 = local_6f0;
    in_stack_fffffffffffff5c8 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_6d0,local_6e0,0x83,1,2,&local_6e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5c8);
  local_708 = 0;
  uStack_700 = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_6f8 = 0;
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff5c8);
  AddrMan::Select(in_stack_fffffffffffff5e0,SUB81((ulong)in_stack_fffffffffffff5d8 >> 0x38,0),
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)in_stack_fffffffffffff5d0);
  CAddress::CAddress((CAddress *)in_stack_fffffffffffff5d8,(CAddress *)in_stack_fffffffffffff5d0);
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~pair((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *)in_stack_fffffffffffff5c8);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::~unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                    *)in_stack_fffffffffffff5c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff608,
               (const_string *)in_stack_fffffffffffff600,(size_t)in_stack_fffffffffffff5f8,
               (const_string *)in_stack_fffffffffffff5f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff5d0,(char (*) [1])in_stack_fffffffffffff5c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               (unsigned_long)in_stack_fffffffffffff5c8);
    CService::ToStringAddrPort_abi_cxx11_(in_stack_fffffffffffff600);
    in_stack_fffffffffffff5d8 = "\"250.1.1.1:8333\"";
    in_stack_fffffffffffff5d0 = "250.1.1.1:8333";
    in_stack_fffffffffffff5c8 = "addr_ret3.ToStringAddrPort()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_768,local_778,0x86,1,2,local_348);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff5c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff5c8);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff5c8);
  CService::~CService((CService *)in_stack_fffffffffffff5c8);
  CService::~CService((CService *)in_stack_fffffffffffff5c8);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff5c8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffff5d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_ports)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    BOOST_CHECK_EQUAL(addrman->Size(), 0U);

    // Test 7; Addr with same IP but diff port does not replace existing addr.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    CService addr1_port = ResolveService("250.1.1.1", 8334);
    BOOST_CHECK(addrman->Add({CAddress(addr1_port, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    auto addr_ret2 = addrman->Select().first;
    BOOST_CHECK(addr_ret2.ToStringAddrPort() == "250.1.1.1:8333" || addr_ret2.ToStringAddrPort() == "250.1.1.1:8334");

    // Test: Add same IP but diff port to tried table; this converts the entry with
    // the specified port to tried, but not the other.
    addrman->Good(CAddress(addr1_port, NODE_NONE));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    bool new_only = true;
    auto addr_ret3 = addrman->Select(new_only).first;
    BOOST_CHECK_EQUAL(addr_ret3.ToStringAddrPort(), "250.1.1.1:8333");
}